

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::initializer_list<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          initializer_list<wasm::Expression_*> *list)

{
  ulong uVar1;
  iterator ppEVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = list->_M_len;
  uVar4 = uVar1;
  if (*(ulong *)(this + 0x10) < uVar1) {
    *(ulong *)(this + 0x10) = uVar1;
    pvVar3 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),uVar1 * 8,8);
    *(void **)this = pvVar3;
    uVar4 = list->_M_len;
  }
  if (uVar4 != 0) {
    ppEVar2 = list->_M_array;
    lVar5 = 0;
    do {
      *(undefined8 *)(*(long *)this + lVar5) = *(undefined8 *)((long)ppEVar2 + lVar5);
      lVar5 = lVar5 + 8;
    } while (uVar4 * 8 != lVar5);
  }
  *(ulong *)(this + 8) = uVar1;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }